

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O3

string * __thiscall
CodeGen::generateEnumType_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this,NodePtr *n)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  
  iVar3 = (*n->px->_vptr_Node[3])();
  lVar1 = *(long *)(CONCAT44(extraout_var,iVar3) + 0x20);
  lVar2 = *(long *)(CONCAT44(extraout_var,iVar3) + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,lVar1,lVar2 + lVar1);
  poVar5 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"enum ",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(__return_storage_ptr__->_M_dataplus)._M_p,
                      __return_storage_ptr__->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," {\n",3);
  iVar3 = (*n->px->_vptr_Node[7])();
  if (CONCAT44(extraout_var_00,iVar3) != 0) {
    uVar6 = 0;
    do {
      poVar5 = this->os_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    ",4);
      iVar4 = (*n->px->_vptr_Node[8])(n->px,uVar6 & 0xffffffff);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)CONCAT44(extraout_var_01,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var_01,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",\n",2);
      uVar6 = uVar6 + 1;
    } while (CONCAT44(extraout_var_00,iVar3) != uVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"};\n\n",4);
  return __return_storage_ptr__;
}

Assistant:

string CodeGen::generateEnumType(const NodePtr& n)
{
    string s = decorate(n->name());
    os_ << "enum " << s << " {\n";
    size_t c = n->names();
    for (size_t i = 0; i < c; ++i) {
        os_ << "    " << n->nameAt(i) << ",\n";
    }
    os_ << "};\n\n";
    return s;
}